

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::UnitTestOptions::GetOutputFormat_abi_cxx11_(void)

{
  char *__s;
  char *pcVar1;
  string *in_RDI;
  char *colon;
  char *gtest_output_flag;
  undefined2 in_stack_ffffffffffffffd0;
  byte bVar2;
  undefined5 in_stack_ffffffffffffffd3;
  char *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  byte bVar3;
  allocator<char> in_stack_ffffffffffffffe7;
  
  __s = (char *)std::__cxx11::string::c_str();
  pcVar1 = strchr(__s,0x3a);
  bVar3 = 0;
  bVar2 = 0;
  if (pcVar1 == (char *)0x0) {
    std::allocator<char>::allocator();
    bVar3 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffffe7,CONCAT16(1,in_stack_ffffffffffffffe0)),
               in_stack_ffffffffffffffd8,
               (allocator<char> *)
               CONCAT53(in_stack_ffffffffffffffd3,CONCAT12(bVar2,in_stack_ffffffffffffffd0)));
  }
  else {
    std::allocator<char>::allocator();
    bVar2 = 1;
    std::__cxx11::string::string
              ((string *)in_RDI,__s,(long)pcVar1 - (long)__s,(allocator *)&stack0xffffffffffffffd3);
  }
  if ((bVar2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd3);
  }
  if ((bVar3 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe7);
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetOutputFormat() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  const char* const colon = strchr(gtest_output_flag, ':');
  return (colon == nullptr)
             ? std::string(gtest_output_flag)
             : std::string(gtest_output_flag,
                           static_cast<size_t>(colon - gtest_output_flag));
}